

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[5],char[15]>
          (Capturer *this,size_t index,char (*value) [5],char (*values) [15])

{
  string local_48;
  char (*local_28) [15];
  char (*values_local) [15];
  char (*value_local) [5];
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = (char (*) [15])value;
  value_local = (char (*) [5])index;
  index_local = (size_t)this;
  Detail::stringify<char[5]>(&local_48,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<char[15]>(this,(size_t)(*value_local + 1),local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }